

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void calc_mean_and_sd_weighted<float,int,std::vector<double,std::allocator<double>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean,vector<double,_std::allocator<double>_> *w
               )

{
  int *piVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  int *piVar12;
  long lVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble lVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  double dVar19;
  
  lVar13 = (long)Xc_indptr[col_num];
  lVar5 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  puVar11 = ix_arr + st;
  puVar10 = ix_arr + end + 1;
  uVar7 = (long)puVar10 - (long)puVar11 >> 3;
  if (0 < (long)uVar7) {
    do {
      uVar6 = uVar7 >> 1;
      uVar9 = ~uVar6 + uVar7;
      uVar7 = uVar6;
      if ((puVar11 + uVar6 + 1)[-1] < (ulong)(long)Xc_ind[lVar13]) {
        puVar11 = puVar11 + uVar6 + 1;
        uVar7 = uVar9;
      }
    } while (0 < (long)uVar7);
  }
  lVar14 = (longdouble)0;
  if (st <= end) {
    lVar14 = (longdouble)0;
    do {
      lVar14 = lVar14 + (longdouble)
                        (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[ix_arr[st]];
      st = st + 1;
    } while (st <= end);
  }
  if ((puVar11 != puVar10) && (lVar5 != lVar13)) {
    iVar2 = Xc_ind[lVar5 + -1];
    pdVar4 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar17 = (longdouble)0;
    lVar18 = lVar17;
    lVar16 = lVar17;
    while (uVar7 = *puVar11, uVar7 <= (ulong)(long)iVar2) {
      piVar1 = Xc_ind + lVar13;
      iVar3 = *piVar1;
      if (iVar3 == (int)uVar7) {
        lVar15 = (longdouble)pdVar4[uVar7];
        if ((uint)ABS(Xc[lVar13]) < 0x7f800000) {
          lVar16 = lVar16 + lVar15;
          lVar17 = in_ST0;
          lVar15 = in_ST0;
          fmal();
          fmal();
          lVar18 = in_ST0;
          in_ST0 = lVar15;
        }
        else {
          lVar14 = lVar14 - lVar15;
        }
        if ((puVar11 == ix_arr + end) || (lVar13 == lVar5 + -1)) break;
        piVar12 = piVar1 + 1;
        puVar11 = puVar11 + 1;
        uVar7 = (long)Xc_ind + (lVar5 * 4 - (long)piVar12) >> 2;
        if (0 < (long)uVar7) {
          do {
            uVar6 = uVar7 >> 1;
            uVar9 = ~uVar6 + uVar7;
            uVar7 = uVar6;
            if ((ulong)(long)piVar12[uVar6] < *puVar11) {
              piVar12 = piVar12 + uVar6 + 1;
              uVar7 = uVar9;
            }
          } while (0 < (long)uVar7);
        }
LAB_0028a885:
        lVar13 = (long)piVar12 - (long)Xc_ind >> 2;
      }
      else {
        if (iVar3 <= (int)uVar7) {
          piVar12 = piVar1 + 1;
          uVar6 = (long)Xc_ind + (lVar5 * 4 - (long)(piVar1 + 1)) >> 2;
          while (0 < (long)uVar6) {
            uVar9 = uVar6 >> 1;
            uVar8 = ~uVar9 + uVar6;
            uVar6 = uVar9;
            if ((ulong)(long)piVar12[uVar9] < uVar7) {
              piVar12 = piVar12 + uVar9 + 1;
              uVar6 = uVar8;
            }
          }
          goto LAB_0028a885;
        }
        puVar11 = puVar11 + 1;
        uVar7 = (long)puVar10 - (long)puVar11 >> 3;
        while (0 < (long)uVar7) {
          uVar6 = uVar7 >> 1;
          uVar9 = ~uVar6 + uVar7;
          uVar7 = uVar6;
          if ((puVar11 + uVar6 + 1)[-1] < (ulong)(long)iVar3) {
            puVar11 = puVar11 + uVar6 + 1;
            uVar7 = uVar9;
          }
        }
      }
      if ((puVar11 == puVar10) || (lVar13 == lVar5)) break;
    }
    if ((lVar16 != (longdouble)0) || (NAN(lVar16) || NAN((longdouble)0))) {
      if (lVar16 < lVar14) {
        lVar17 = lVar18 * lVar18 * ((longdouble)1 - lVar16 / lVar14) * lVar16 + lVar17;
        lVar18 = lVar18 * (lVar16 / lVar14);
      }
      *x_mean = (double)lVar18;
      dVar19 = (double)SQRT(lVar17 / lVar14);
      goto LAB_0028a8d7;
    }
  }
  *x_mean = 0.0;
  dVar19 = 0.0;
LAB_0028a8d7:
  *x_sd = dVar19;
  return;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}